

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O3

vector<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_> *
BitSetsFromSets<128ul>
          (vector<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_> *__return_storage_ptr__,
          vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *names)

{
  pointer *ppbVar1;
  _WordT *p_Var2;
  pointer puVar3;
  iterator __position;
  pointer pbVar4;
  const_iterator cVar5;
  undefined8 uVar6;
  pointer puVar7;
  _Hash_node_base *p_Var8;
  bitset<128UL> x;
  bitset<128UL> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Base_bitset<2UL>._M_w[0] = 0;
  local_48.super__Base_bitset<2UL>._M_w[1] = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>::reserve
            (__return_storage_ptr__,
             ((long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  puVar7 = (sets->
           super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (sets->
           super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar7 == puVar3) {
      return __return_storage_ptr__;
    }
    local_48.super__Base_bitset<2UL>._M_w[0] = 0;
    local_48.super__Base_bitset<2UL>._M_w[1] = 0;
    for (p_Var8 = (puVar7->_M_h)._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
        p_Var8 = p_Var8->_M_nxt) {
      cVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&names->_M_h,(key_type *)(p_Var8 + 1));
      if (cVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar6 = std::__throw_out_of_range("_Map_base::at");
        pbVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (pbVar4 != (pointer)0x0) {
          operator_delete(pbVar4);
        }
        _Unwind_Resume(uVar6);
      }
      p_Var2 = local_48.super__Base_bitset<2UL>._M_w +
               (*(ulong *)((long)cVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28) >> 6);
      *p_Var2 = *p_Var2 | 1L << (*(ulong *)((long)cVar5.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                  ._M_cur + 0x28) & 0x3f);
    }
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::bitset<128ul>,std::allocator<std::bitset<128ul>>>::
      _M_realloc_insert<std::bitset<128ul>&>
                ((vector<std::bitset<128ul>,std::allocator<std::bitset<128ul>>> *)
                 __return_storage_ptr__,__position,&local_48);
    }
    else {
      ((__position._M_current)->super__Base_bitset<2UL>)._M_w[0] =
           local_48.super__Base_bitset<2UL>._M_w[0];
      ((__position._M_current)->super__Base_bitset<2UL>)._M_w[1] =
           local_48.super__Base_bitset<2UL>._M_w[1];
      ppbVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::bitset<128UL>,_std::allocator<std::bitset<128UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

std::vector<std::bitset<n_entities>> BitSetsFromSets(
        const std::vector<Set>& sets,
        const std::unordered_map<std::string, size_t>& names)
{
    std::bitset<n_entities> x;
    std::vector<std::bitset<n_entities>> binary_sets;
    binary_sets.reserve(sets.size());
    for (const auto& set : sets)
    {
        x.reset();
        for (const auto& elem : set)
            x[names.at(elem)] = true;
        binary_sets.emplace_back(x);
    }
    return binary_sets;
}